

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase85::run(TestCase85 *this)

{
  PointerBuilder builder_00;
  Builder reader;
  Reader reader_00;
  Reader reader_01;
  PointerType PVar1;
  ArrayPtr<const_unsigned_int> value;
  initializer_list<unsigned_int> expected;
  initializer_list<unsigned_int> expected_00;
  initializer_list<unsigned_int> expected_01;
  DebugExpression<bool> _kjCondition_1;
  DebugExpression<bool> _kjCondition;
  Builder root;
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> orphan;
  MallocMessageBuilder builder;
  DebugComparison<capnp::Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>_&,_std::nullptr_t>
  local_228;
  int local_200;
  PointerReader local_1f8;
  StructBuilder local_1d8;
  OrphanBuilder local_1b0;
  ListBuilder local_190;
  ListReader local_168;
  ListReader local_138;
  MallocMessageBuilder local_108;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_108,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_1f8,&local_108.super_MessageBuilder);
  local_228.op.content.ptr = (char *)local_1f8.pointer;
  local_228.left = (Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_1f8.segment;
  local_228.right = local_1f8.capTable;
  PointerBuilder::initStruct(&local_1d8,(PointerBuilder *)&local_228,(StructSize)0x140006);
  local_1f8.segment = (SegmentReader *)0x220000000c;
  local_1f8.capTable = (CapTableReader *)CONCAT44(local_1f8.capTable._4_4_,0x38);
  local_228.op.content.ptr = (char *)(local_1d8.pointers + 0xb);
  local_228.left = (Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_1d8.segment;
  local_228.right = local_1d8.capTable;
  builder_00.capTable = local_1d8.capTable;
  builder_00.segment = local_1d8.segment;
  builder_00.pointer = (WirePointer *)local_228.op.content.ptr;
  value.size_ = 3;
  value.ptr = (uint *)&local_1f8;
  PointerHelpers<capnp::List<unsigned_int,_(capnp::Kind)0>,_(capnp::Kind)6>::set(builder_00,value);
  local_228.op.content.ptr = (char *)(local_1d8.pointers + 0xb);
  local_228.left = (Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_1d8.segment;
  local_228.right = local_1d8.capTable;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_228);
  local_1f8.segment = (SegmentReader *)CONCAT71(local_1f8.segment._1_7_,PVar1 != NULL_);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x5a,ERROR,"\"failed: expected \" \"root.hasUInt32List()\", _kjCondition",
               (char (*) [38])"failed: expected root.hasUInt32List()",
               (DebugExpression<bool> *)&local_1f8);
  }
  local_1f8.pointer = local_1d8.pointers + 0xb;
  local_1f8.segment = &(local_1d8.segment)->super_SegmentReader;
  local_1f8.capTable = &(local_1d8.capTable)->super_CapTableReader;
  PointerBuilder::disown((OrphanBuilder *)&local_228,(PointerBuilder *)&local_1f8);
  local_1b0.capTable = (CapTableBuilder *)local_228.op.content.ptr;
  local_1b0.location = (word *)local_228.op.content.size_;
  local_1b0.tag.content = (uint64_t)local_228.left;
  local_1b0.segment = (SegmentBuilder *)local_228.right;
  local_228.left =
       (Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)
       CONCAT71(local_228.left._1_7_,(word *)local_228.op.content.size_ != (word *)0x0);
  if (((word *)local_228.op.content.size_ == (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x5d,ERROR,"\"failed: expected \" \"!(orphan == nullptr)\", _kjCondition",
               (char (*) [38])"failed: expected !(orphan == nullptr)",
               (DebugExpression<bool> *)&local_228);
  }
  OrphanBuilder::asListReader(&local_138,&local_1b0,FOUR_BYTES);
  local_228.left = (Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)0x220000000c;
  local_228.right._0_4_ = 0x38;
  reader_00.reader.capTable = local_138.capTable;
  reader_00.reader.segment = local_138.segment;
  reader_00.reader.ptr = local_138.ptr;
  reader_00.reader.elementCount = local_138.elementCount;
  reader_00.reader.step = local_138.step;
  reader_00.reader.structDataSize = local_138.structDataSize;
  reader_00.reader.structPointerCount = local_138.structPointerCount;
  reader_00.reader.elementSize = local_138.elementSize;
  reader_00.reader._39_1_ = local_138._39_1_;
  reader_00.reader.nestingLimit = local_138.nestingLimit;
  reader_00.reader._44_4_ = local_138._44_4_;
  expected._M_len = 3;
  expected._M_array = (iterator)&local_228;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_int,_(capnp::Kind)0>_>
            (reader_00,expected);
  OrphanBuilder::asList(&local_190,&local_1b0,FOUR_BYTES);
  local_228.left = (Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)0x220000000c;
  local_228.right = (void *)CONCAT44(local_228.right._4_4_,0x38);
  reader.builder.capTable = local_190.capTable;
  reader.builder.segment = local_190.segment;
  reader.builder.ptr = local_190.ptr;
  reader.builder.elementCount = local_190.elementCount;
  reader.builder.step = local_190.step;
  reader.builder.structDataSize = local_190.structDataSize;
  reader.builder.structPointerCount = local_190.structPointerCount;
  reader.builder.elementSize = local_190.elementSize;
  reader.builder._39_1_ = local_190._39_1_;
  expected_00._M_len = 3;
  expected_00._M_array = (iterator)&local_228;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_int,_(capnp::Kind)0>,_false>
            (reader,expected_00);
  local_228.op.content.ptr = (char *)(local_1d8.pointers + 0xb);
  local_228.left = (Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_1d8.segment;
  local_228.right = local_1d8.capTable;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_228);
  local_1f8.segment = (SegmentReader *)CONCAT71(local_1f8.segment._1_7_,PVar1 == NULL_);
  if ((PVar1 != NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[41],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x61,ERROR,"\"failed: expected \" \"!(root.hasUInt32List())\", _kjCondition",
               (char (*) [41])"failed: expected !(root.hasUInt32List())",
               (DebugExpression<bool> *)&local_1f8);
  }
  local_228.op.content.ptr = (char *)(local_1d8.pointers + 0xb);
  local_228.left = (Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_1d8.segment;
  local_228.right = local_1d8.capTable;
  PointerBuilder::adopt((PointerBuilder *)&local_228,&local_1b0);
  local_228.result = local_1b0.location == (word *)0x0;
  local_228.right = (void *)0x0;
  local_228.op.content.ptr = " == ";
  local_228.op.content.size_ = (size_t)&DAT_00000005;
  if ((!local_228.result) && (kj::_::Debug::minSeverity < 3)) {
    local_228.left = (Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)&local_1b0;
    kj::_::Debug::
    log<char_const(&)[35],kj::_::DebugComparison<capnp::Orphan<capnp::List<unsigned_int,(capnp::Kind)0>>&,decltype(nullptr)>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,100,ERROR,"\"failed: expected \" \"orphan == nullptr\", _kjCondition",
               (char (*) [35])"failed: expected orphan == nullptr",&local_228);
  }
  local_228.op.content.ptr = (char *)(local_1d8.pointers + 0xb);
  local_228.left = (Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_1d8.segment;
  local_228.right = local_1d8.capTable;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_228);
  local_1f8.segment = (SegmentReader *)CONCAT71(local_1f8.segment._1_7_,PVar1 != NULL_);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x65,ERROR,"\"failed: expected \" \"root.hasUInt32List()\", _kjCondition",
               (char (*) [38])"failed: expected root.hasUInt32List()",
               (DebugExpression<bool> *)&local_1f8);
  }
  StructBuilder::asReader(&local_1d8);
  if ((ushort)local_228._36_2_ < 0xc) {
    local_200 = 0x7fffffff;
    local_1f8.capTable = (CapTableReader *)0x0;
    local_1f8.pointer = (WirePointer *)0x0;
    local_1f8.segment = (SegmentReader *)0x0;
  }
  else {
    local_1f8.pointer = (WirePointer *)(local_228.op.content.size_ + 0x58);
    local_1f8.capTable = (CapTableReader *)local_228.right;
    local_1f8.segment = (SegmentReader *)local_228.left;
  }
  local_1f8.nestingLimit = local_200;
  PointerReader::getList(&local_168,&local_1f8,FOUR_BYTES,(word *)0x0);
  local_1f8.segment = (SegmentReader *)0x220000000c;
  local_1f8.capTable = (CapTableReader *)CONCAT44(local_1f8.capTable._4_4_,0x38);
  reader_01.reader.capTable = local_168.capTable;
  reader_01.reader.segment = local_168.segment;
  reader_01.reader.ptr = local_168.ptr;
  reader_01.reader.elementCount = local_168.elementCount;
  reader_01.reader.step = local_168.step;
  reader_01.reader.structDataSize = local_168.structDataSize;
  reader_01.reader.structPointerCount = local_168.structPointerCount;
  reader_01.reader.elementSize = local_168.elementSize;
  reader_01.reader._39_1_ = local_168._39_1_;
  reader_01.reader.nestingLimit = local_168.nestingLimit;
  reader_01.reader._44_4_ = local_168._44_4_;
  expected_01._M_len = 3;
  expected_01._M_array = (iterator)&local_1f8;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_int,_(capnp::Kind)0>_>
            (reader_01,expected_01);
  if (local_1b0.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_1b0);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_108);
  return;
}

Assistant:

TEST(Orphans, Lists) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  root.setUInt32List({12, 34, 56});
  EXPECT_TRUE(root.hasUInt32List());

  Orphan<List<uint32_t>> orphan = root.disownUInt32List();
  EXPECT_FALSE(orphan == nullptr);

  checkList(orphan.getReader(), {12u, 34u, 56u});
  checkList(orphan.get(), {12u, 34u, 56u});
  EXPECT_FALSE(root.hasUInt32List());

  root.adoptUInt32List(kj::mv(orphan));
  EXPECT_TRUE(orphan == nullptr);
  EXPECT_TRUE(root.hasUInt32List());
  checkList(root.asReader().getUInt32List(), {12u, 34u, 56u});
}